

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FunctionBody.cpp
# Opt level: O3

void __thiscall
Js::FunctionBody::InsertSymbolToRegSlotList
          (FunctionBody *this,RegSlot reg,PropertyId propertyId,RegSlot totalRegsCount)

{
  code *pcVar1;
  bool bVar2;
  void *pvVar3;
  PropertyIdOnRegSlotsContainer *pPVar4;
  long *plVar5;
  undefined4 *puVar6;
  
  if (totalRegsCount == 0) {
    return;
  }
  pvVar3 = FunctionProxy::GetAuxPtr((FunctionProxy *)this,PropertyIdOnRegSlotsContainer);
  if (pvVar3 == (void *)0x0) {
    pPVar4 = PropertyIdOnRegSlotsContainer::New
                       (((this->super_ParseableFunctionInfo).super_FunctionProxy.m_scriptContext)->
                        recycler);
    FunctionProxy::SetAuxPtr((FunctionProxy *)this,PropertyIdOnRegSlotsContainer,pPVar4);
  }
  plVar5 = (long *)FunctionProxy::GetAuxPtr((FunctionProxy *)this,PropertyIdOnRegSlotsContainer);
  if (*plVar5 == 0) {
    pPVar4 = (PropertyIdOnRegSlotsContainer *)
             FunctionProxy::GetAuxPtr((FunctionProxy *)this,PropertyIdOnRegSlotsContainer);
    PropertyIdOnRegSlotsContainer::CreateRegSlotsArray
              (pPVar4,((this->super_ParseableFunctionInfo).super_FunctionProxy.m_scriptContext)->
                      recycler,totalRegsCount);
  }
  pvVar3 = FunctionProxy::GetAuxPtr((FunctionProxy *)this,PropertyIdOnRegSlotsContainer);
  if (pvVar3 == (void *)0x0) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar6 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
    *puVar6 = 1;
    bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Base/FunctionBody.cpp"
                                ,0x134e,"(this->GetPropertyIdOnRegSlotsContainer() != nullptr)",
                                "this->GetPropertyIdOnRegSlotsContainer() != nullptr");
    if (!bVar2) {
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    *puVar6 = 0;
  }
  pPVar4 = (PropertyIdOnRegSlotsContainer *)
           FunctionProxy::GetAuxPtr((FunctionProxy *)this,PropertyIdOnRegSlotsContainer);
  PropertyIdOnRegSlotsContainer::Insert(pPVar4,reg,propertyId);
  return;
}

Assistant:

void FunctionBody::InsertSymbolToRegSlotList(RegSlot reg, PropertyId propertyId, RegSlot totalRegsCount)
    {
        if (totalRegsCount > 0)
        {
            if (this->GetPropertyIdOnRegSlotsContainer() == nullptr)
            {
                this->SetPropertyIdOnRegSlotsContainer(PropertyIdOnRegSlotsContainer::New(m_scriptContext->GetRecycler()));
            }

            if (this->GetPropertyIdOnRegSlotsContainer()->propertyIdsForRegSlots == nullptr)
            {
                this->GetPropertyIdOnRegSlotsContainer()->CreateRegSlotsArray(m_scriptContext->GetRecycler(), totalRegsCount);
            }

            Assert(this->GetPropertyIdOnRegSlotsContainer() != nullptr);
            this->GetPropertyIdOnRegSlotsContainer()->Insert(reg, propertyId);
        }
    }